

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

char * __thiscall
testing::internal::UntypedFunctionMockerBase::Name(UntypedFunctionMockerBase *this)

{
  MutexBase *in_RDI;
  MutexLock l;
  char *name;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int line;
  allocator *file;
  undefined1 in_stack_ffffffffffffffb7;
  allocator local_39;
  string local_38 [40];
  char *local_10;
  
  GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI)
  ;
  line = CONCAT13(*(long *)((long)&in_RDI->mutex_ + 0x10) != 0,(int3)in_stack_ffffffffffffffa4);
  file = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"Name() must not be called before SetOwnerAndName() has been called.",file);
  Assert((bool)in_stack_ffffffffffffffb7,(char *)file,line,(string *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_10 = *(char **)((long)&in_RDI->mutex_ + 0x10);
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x15d4e9);
  return local_10;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const char* name;
  {
    // We protect name_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(name_ != NULL, __FILE__, __LINE__,
           "Name() must not be called before SetOwnerAndName() has "
           "been called.");
    name = name_;
  }
  return name;
}